

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnEnd(TypeChecker *this,Label *label,char *sig_desc,char *end_desc)

{
  Type *pTVar1;
  Result RVar2;
  Result RVar3;
  Label *__p;
  Type *pTVar4;
  
  RVar2 = PopAndCheckSignature(this,&label->result_types,sig_desc);
  RVar3 = CheckTypeStackEnd(this,end_desc);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
            (&this->type_stack_,label->type_stack_limit);
  pTVar1 = (label->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pTVar4 = (label->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    PushType(this,*pTVar4);
  }
  __p = (this->label_stack_).
        super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
        _M_impl.super__Vector_impl_data._M_finish + -1;
  (this->label_stack_).
  super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<wabt::TypeChecker::Label>::destroy<wabt::TypeChecker::Label>
            ((new_allocator<wabt::TypeChecker::Label> *)&this->label_stack_,__p);
  return (Result)(uint)(RVar3.enum_ == Error || RVar2.enum_ == Error);
}

Assistant:

Result TypeChecker::OnEnd(Label* label,
                          const char* sig_desc,
                          const char* end_desc) {
  Result result = Result::Ok;
  result |= PopAndCheckSignature(label->result_types, sig_desc);
  result |= CheckTypeStackEnd(end_desc);
  ResetTypeStackToLabel(label);
  PushTypes(label->result_types);
  PopLabel();
  return result;
}